

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

uint32_t __thiscall tinyusdz::Attribute::type_id(Attribute *this)

{
  bool bVar1;
  long lVar2;
  Attribute *this_local;
  
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    bVar1 = is_connection(this);
    if (bVar1) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = primvar::PrimVar::type_id(&this->_var);
    }
  }
  else {
    this_local._4_4_ = tinyusdz::value::GetTypeId(&this->_type_name);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t type_id() const {
    if (_type_name.size()) {
      return value::GetTypeId(_type_name);
    }

    if (!is_connection()) {
      // Fallback. May be unreliable(`var` could be empty).
      return _var.type_id();
    }

    return value::TYPE_ID_INVALID;
  }